

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

ON_ClassArray<ON_3dmView> * __thiscall
ON_ClassArray<ON_3dmView>::operator=(ON_ClassArray<ON_3dmView> *this,ON_ClassArray<ON_3dmView> *src)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  if (this != src) {
    iVar1 = src->m_count;
    if ((long)iVar1 < 1) {
      this->m_count = 0;
    }
    else {
      if (this->m_capacity < iVar1) {
        SetCapacity(this,(long)iVar1);
      }
      if (this->m_a != (ON_3dmView *)0x0) {
        iVar1 = src->m_count;
        this->m_count = iVar1;
        lVar3 = 0;
        for (lVar2 = 0; lVar2 < iVar1; lVar2 = lVar2 + 1) {
          ON_3dmView::operator=
                    ((ON_3dmView *)
                     ((long)&(this->m_a->m_vp).super_ON_Geometry.super_ON_Object._vptr_ON_Object +
                     lVar3),(ON_3dmView *)
                            ((long)&(src->m_a->m_vp).super_ON_Geometry.super_ON_Object.
                                    _vptr_ON_Object + lVar3));
          iVar1 = this->m_count;
          lVar3 = lVar3 + 0x5f0;
        }
      }
    }
  }
  return this;
}

Assistant:

ON_ClassArray<T>& ON_ClassArray<T>::operator=( const ON_ClassArray<T>& src )
{
  int i;
  if( this != &src ) {
    if ( src.m_count <= 0 ) {
      m_count = 0;
    }
    else {
      if ( m_capacity < src.m_count ) {
        SetCapacity( src.m_count );
      }
      if ( m_a ) {
        m_count = src.m_count;
        for ( i = 0; i < m_count; i++ ) {
          m_a[i] = src.m_a[i];
        }
      }
    }
  }  
  return *this;
}